

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qc_putters.c
# Opt level: O0

int qc_putterschain_remove(QcPuttersChain *putterChain,QcPutter *putter)

{
  int iVar1;
  int ret;
  int bucket_sn;
  QcPutter *putter_local;
  QcPuttersChain *putterChain_local;
  
  if (((putterChain == (QcPuttersChain *)0x0) || (putter == (QcPutter *)0x0)) &&
     ((fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
               ,0x12a), putterChain == (QcPuttersChain *)0x0 || (putter == (QcPutter *)0x0)))) {
    __assert_fail("((void*)0) != putterChain && ((void*)0) != putter",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                  ,0x12a,"int qc_putterschain_remove(QcPuttersChain *, QcPutter *)");
  }
  qc_thread_wrlock_lock(putterChain->rwlock);
  if (putter->_entry == (QcListEntry *)0x0) {
    qc_thread_wrlock_unlock(putterChain->rwlock);
    putterChain_local._4_4_ = -1;
  }
  else {
    iVar1 = qc_list_removeentry(putterChain->putBuckets[putter->priority + -1]->puttersChain,
                                putter->_entry);
    if ((iVar1 != 0) &&
       (fprintf(_stderr,"stderr: assert throw. [%s  line:%d]\n",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                ,0x134), iVar1 != 0)) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/zhanglw-dev[P]queue-c/src/qc_mq/qc_putters.c"
                    ,0x134,"int qc_putterschain_remove(QcPuttersChain *, QcPutter *)");
    }
    putterChain->putter_count = putterChain->putter_count + -1;
    qc_thread_wrlock_unlock(putterChain->rwlock);
    putterChain_local._4_4_ = 0;
  }
  return putterChain_local._4_4_;
}

Assistant:

int qc_putterschain_remove(QcPuttersChain *putterChain, QcPutter *putter) {
	qc_assert(NULL != putterChain && NULL != putter);

	qc_thread_wrlock_lock(putterChain->rwlock);
	int bucket_sn = putter->priority - 1;

	if(putter->_entry == NULL){  //null if putter is popped
		qc_thread_wrlock_unlock(putterChain->rwlock);
		return -1;
	}
	int ret = qc_list_removeentry(putterChain->putBuckets[bucket_sn]->puttersChain, putter->_entry);
	qc_assert(ret == 0);

	putterChain->putter_count--;
	qc_thread_wrlock_unlock(putterChain->rwlock);
	return 0;
}